

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lptree.c
# Opt level: O2

int verifyrule(lua_State *L,TTree *tree,int *passed,int npassed,int nb)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)npassed;
LAB_00126dce:
  do {
    switch(tree->tag) {
    case '\0':
    case '\x01':
    case '\x02':
    case '\x04':
      return nb;
    case '\x03':
    case '\x0e':
      return 1;
    case '\x05':
    case '\b':
    case '\t':
      tree = tree + 1;
      nb = 1;
      goto LAB_00126dce;
    case '\x06':
      iVar1 = verifyrule(L,tree + 1,passed,(int)uVar5,0);
      if (iVar1 == 0) {
        return nb;
      }
      break;
    case '\a':
      nb = verifyrule(L,tree + 1,passed,(int)uVar5,nb);
      break;
    case '\n':
      break;
    default:
      return 0;
    case '\f':
      if (999 < (long)uVar5) {
        uVar5 = uVar5 & 0xffffffff;
        do {
          iVar1 = (int)uVar5;
          if (iVar1 < 1) {
            iVar1 = luaL_error(L,"too many left calls in grammar");
            return iVar1;
          }
          uVar5 = uVar5 - 1;
          uVar3 = iVar1 - 2;
          while (-1 < (int)uVar3) {
            uVar4 = (ulong)uVar3;
            uVar3 = uVar3 - 1;
            if (passed[uVar5] == passed[uVar4]) {
              lua_rawgeti(L,-1,(long)passed[uVar5]);
              pcVar2 = val2str(L,-1);
              iVar1 = luaL_error(L,"rule \'%s\' may be left recursive",pcVar2);
              return iVar1;
            }
          }
        } while( true );
      }
      passed[uVar5] = (uint)tree->key;
      uVar5 = uVar5 + 1;
      goto switchD_00126de0_caseD_f;
    case '\r':
      iVar1 = checkaux(tree,0);
      return iVar1;
    case '\x0f':
    case '\x10':
      goto switchD_00126de0_caseD_f;
    }
    tree = tree + (tree->u).ps;
  } while( true );
switchD_00126de0_caseD_f:
  tree = tree + 1;
  goto LAB_00126dce;
}

Assistant:

static int verifyrule (lua_State *L, TTree *tree, int *passed, int npassed,
                       int nb) {
 tailcall:
  switch (tree->tag) {
    case TChar: case TSet: case TAny:
    case TFalse:
      return nb;  /* cannot pass from here */
    case TTrue:
    case TBehind:  /* look-behind cannot have calls */
      return 1;
    case TNot: case TAnd: case TRep:
      /* return verifyrule(L, sib1(tree), passed, npassed, 1); */
      tree = sib1(tree); nb = 1; goto tailcall;
    case TCapture: case TRunTime:
      /* return verifyrule(L, sib1(tree), passed, npassed, nb); */
      tree = sib1(tree); goto tailcall;
    case TCall:
      /* return verifyrule(L, sib2(tree), passed, npassed, nb); */
      tree = sib2(tree); goto tailcall;
    case TSeq:  /* only check 2nd child if first is nb */
      if (!verifyrule(L, sib1(tree), passed, npassed, 0))
        return nb;
      /* else return verifyrule(L, sib2(tree), passed, npassed, nb); */
      tree = sib2(tree); goto tailcall;
    case TChoice:  /* must check both children */
      nb = verifyrule(L, sib1(tree), passed, npassed, nb);
      /* return verifyrule(L, sib2(tree), passed, npassed, nb); */
      tree = sib2(tree); goto tailcall;
    case TRule:
      if (npassed >= MAXRULES)
        return verifyerror(L, passed, npassed);
      else {
        passed[npassed++] = tree->key;
        /* return verifyrule(L, sib1(tree), passed, npassed); */
        tree = sib1(tree); goto tailcall;
      }
    case TGrammar:
      return nullable(tree);  /* sub-grammar cannot be left recursive */
    default: assert(0); return 0;
  }
}